

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcessOutput.cxx
# Opt level: O0

void __thiscall
cmProcessOutput::cmProcessOutput(cmProcessOutput *this,Encoding encoding,uint maxSize)

{
  uint maxSize_local;
  Encoding encoding_local;
  cmProcessOutput *this_local;
  
  return;
}

Assistant:

cmProcessOutput::cmProcessOutput(Encoding encoding, unsigned int maxSize)
{
#if defined(_WIN32)
  codepage = 0;
  bufferSize = maxSize;
  if (encoding == None) {
    codepage = defaultCodepage;
  } else if (encoding == Auto) {
    codepage = GetConsoleCP();
  } else if (encoding == UTF8) {
    codepage = CP_UTF8;
  } else if (encoding == OEM) {
    codepage = GetOEMCP();
  }
  if (!codepage || encoding == ANSI) {
    codepage = GetACP();
  }
#else
  static_cast<void>(encoding);
  static_cast<void>(maxSize);
#endif
}